

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O2

HTTPAPI_RESULT
HTTPAPI_ExecuteRequest
          (HTTP_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE httpHeadersHandle,uchar *content,size_t contentLength,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHeadersHandle,BUFFER_HANDLE responseContent)

{
  HTTP_HEADERS_RESULT HVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  HTTPAPI_RESULT HVar8;
  HTTPAPI_RESULT HVar9;
  char *pcVar10;
  size_t sVar11;
  ulong index;
  char *pcVar12;
  undefined8 uVar13;
  long local_70;
  char *tempBuffer;
  size_t sStack_60;
  char local_58;
  long httpCode;
  size_t local_48;
  ulong local_40;
  size_t headersCount;
  
  if ((httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0 ||
       (relativePath == (char *)0x0 || handle == (HTTP_HANDLE)0x0)) ||
     (contentLength != 0 && content == (uchar *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    iVar2 = 0x204;
  }
  else {
    HVar1 = HTTPHeaders_GetHeaderCount(httpHeadersHandle,&headersCount);
    if (HVar1 == HTTP_HEADERS_OK) {
      local_48 = contentLength;
      local_40 = (ulong)requestType;
      sVar4 = strlen(handle->hostURL);
      sVar5 = strlen(relativePath);
      sVar11 = sVar5 + sVar4;
      if (CARRY8(sVar5,sVar4)) {
        sVar11 = 0xffffffffffffffff;
      }
      sVar4 = sVar11 + 1;
      if (sVar11 + 1 == 0) {
        sVar4 = 0xffffffffffffffff;
      }
      if (sVar4 == 0xffffffffffffffff) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                    ,"HTTPAPI_ExecuteRequest",0x212,1,"Invalid malloc size");
        }
      }
      else {
        pcVar6 = (char *)malloc(sVar4);
        if (pcVar6 != (char *)0x0) {
          iVar2 = curl_easy_setopt(handle->curl,0x29,handle->verbose);
          if (iVar2 == 0) {
            iVar2 = strcpy_s(pcVar6,sVar4,handle->hostURL);
            if ((iVar2 == 0) && (iVar2 = strcat_s(pcVar6,sVar4,relativePath), iVar2 == 0)) {
              iVar2 = curl_easy_setopt(handle->curl,0x2712,pcVar6);
              if (iVar2 == 0) {
                iVar2 = curl_easy_setopt(handle->curl,0x9b,handle->timeout);
                if (iVar2 == 0) {
                  iVar2 = curl_easy_setopt(handle->curl,0x13,handle->lowSpeedLimit);
                  if (iVar2 == 0) {
                    iVar2 = curl_easy_setopt(handle->curl,0x14,handle->lowSpeedTime);
                    if (iVar2 == 0) {
                      iVar2 = curl_easy_setopt(handle->curl,0x4a,handle->freshConnect);
                      if (iVar2 == 0) {
                        iVar2 = curl_easy_setopt(handle->curl,0x4b,handle->forbidReuse);
                        if (iVar2 == 0) {
                          HVar8 = HTTPAPI_INVALID_ARG;
                          iVar2 = curl_easy_setopt(handle->curl,0x54,2);
                          if (iVar2 == 0) {
                            switch((int)local_40) {
                            case 1:
                              iVar2 = curl_easy_setopt(handle->curl,0x50,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                                if (iVar2 == 0) {
LAB_0012c22d:
                                  local_70 = 0;
                                  for (index = 0; index < headersCount; index = index + 1) {
                                    HVar1 = HTTPHeaders_GetHeader
                                                      (httpHeadersHandle,index,&tempBuffer);
                                    if (HVar1 != HTTP_HEADERS_OK) {
                                      p_Var3 = xlogging_get_log_function();
                                      HVar8 = HTTPAPI_HTTP_HEADERS_FAILED;
                                      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012c546;
                                      iVar2 = 0x2cf;
                                      uVar13 = 0xd;
                                      pcVar10 = HTTPAPI_RESULTStringStorage[0xd];
                                      goto LAB_0012c53e;
                                    }
                                    lVar7 = curl_slist_append(local_70,tempBuffer);
                                    if (lVar7 == 0) {
                                      p_Var3 = xlogging_get_log_function();
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x2d8,1,
                                                  "(result = %s%s (%d))","",
                                                  HTTPAPI_RESULTStringStorage[0xf],0xf);
                                      }
                                      free(tempBuffer);
                                      HVar8 = HTTPAPI_ALLOC_FAILED;
                                      goto LAB_0012c546;
                                    }
                                    free(tempBuffer);
                                    local_70 = lVar7;
                                  }
                                  iVar2 = curl_easy_setopt(handle->curl,0x2727,local_70);
                                  if (iVar2 != 0) {
                                    p_Var3 = xlogging_get_log_function();
                                    HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012c546;
                                    iVar2 = 0x2e9;
                                    goto LAB_0012c536;
                                  }
                                  if (content == (uchar *)0x0 || local_48 == 0) {
                                    if (((int)local_40 == 1) ||
                                       ((iVar2 = curl_easy_setopt(handle->curl,0x271f,0), iVar2 == 0
                                        && (iVar2 = curl_easy_setopt(handle->curl,0x3c,0),
                                           iVar2 == 0)))) goto LAB_0012c438;
                                    p_Var3 = xlogging_get_log_function();
                                    HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                      iVar2 = 0x300;
                                      goto LAB_0012c536;
                                    }
                                  }
                                  else {
                                    iVar2 = curl_easy_setopt(handle->curl,0x271f,content);
                                    if ((iVar2 == 0) &&
                                       (iVar2 = curl_easy_setopt(handle->curl,0x3c,local_48),
                                       iVar2 == 0)) {
LAB_0012c438:
                                      iVar2 = curl_easy_setopt(handle->curl,0x272d,0);
                                      if (((iVar2 == 0) &&
                                          (iVar2 = curl_easy_setopt(handle->curl,0x4e6f,0),
                                          iVar2 == 0)) &&
                                         (iVar2 = curl_easy_setopt(handle->curl,0x4e2b,
                                                                   ContentWriteFunction), iVar2 == 0
                                         )) {
                                        if ((responseHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) ||
                                           ((iVar2 = curl_easy_setopt(handle->curl,0x272d,
                                                                      responseHeadersHandle),
                                            iVar2 == 0 &&
                                            (iVar2 = curl_easy_setopt(handle->curl,0x4e6f,
                                                                      HeadersWriteFunction),
                                            iVar2 == 0)))) {
                                          tempBuffer = (char *)0x0;
                                          sStack_60 = 0;
                                          local_58 = '\0';
                                          iVar2 = curl_easy_setopt(handle->curl,0x2711);
                                          if (iVar2 == 0) {
                                            iVar2 = curl_easy_perform();
                                            if (iVar2 == 0) {
                                              iVar2 = curl_easy_getinfo(handle->curl,0x200002,
                                                                        &httpCode);
                                              if (iVar2 == 0) {
                                                if (local_58 == '\0') {
                                                  if (statusCode != (uint *)0x0) {
                                                    *statusCode = (uint)httpCode;
                                                  }
                                                  HVar8 = HTTPAPI_OK;
                                                  HVar9 = HVar8;
                                                  if ((sStack_60 != 0 &&
                                                       responseContent != (BUFFER_HANDLE)0x0) &&
                                                     (iVar2 = BUFFER_build(responseContent,
                                                                           (uchar *)tempBuffer,
                                                                           sStack_60), iVar2 != 0))
                                                  {
                                                    p_Var3 = xlogging_get_log_function();
                                                    HVar9 = HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                                      (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x351,1,
                                                  "(result = %s%s (%d))","",
                                                  HTTPAPI_RESULTStringStorage[0x11],0x11);
                                                  }
                                                  }
                                                  if (299 < CONCAT44(httpCode._4_4_,(uint)httpCode))
                                                  {
                                                    p_Var3 = xlogging_get_log_function();
                                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                                      (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x35b,1,
                                                  "Failure in HTTP communication: server reply code is %ld"
                                                  ,CONCAT44(httpCode._4_4_,(uint)httpCode));
                                                  }
                                                  p_Var3 = xlogging_get_log_function();
                                                  HVar8 = HVar9;
                                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                                    (*p_Var3)(AZ_LOG_INFO,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x35d,1,
                                                  "HTTP Response:%*.*s",sStack_60 & 0xffffffff,
                                                  sStack_60 & 0xffffffff,tempBuffer);
                                                  }
                                                  }
                                                }
                                                else {
                                                  p_Var3 = xlogging_get_log_function();
                                                  HVar8 = HTTPAPI_READ_DATA_FAILED;
                                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                                    iVar2 = 0x342;
                                                    uVar13 = 10;
                                                    pcVar10 = HTTPAPI_RESULTStringStorage[10];
                                                    goto LAB_0012c7b2;
                                                  }
                                                }
                                              }
                                              else {
                                                p_Var3 = xlogging_get_log_function();
                                                HVar8 = HTTPAPI_QUERY_HEADERS_FAILED;
                                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                                  iVar2 = 0x33d;
                                                  uVar13 = 8;
                                                  pcVar10 = HTTPAPI_RESULTStringStorage[8];
                                                  goto LAB_0012c7b2;
                                                }
                                              }
                                            }
                                            else {
                                              p_Var3 = xlogging_get_log_function();
                                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                                uVar13 = curl_easy_strerror();
                                                (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x331,1,
                                                  "curl_easy_perform() failed: %s\n",uVar13);
                                              }
                                              p_Var3 = xlogging_get_log_function();
                                              HVar8 = HTTPAPI_OPEN_REQUEST_FAILED;
                                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                                iVar2 = 0x333;
                                                uVar13 = 4;
                                                pcVar10 = HTTPAPI_RESULTStringStorage[4];
                                                goto LAB_0012c7b2;
                                              }
                                            }
                                          }
                                          else {
                                            p_Var3 = xlogging_get_log_function();
                                            HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                            if (p_Var3 != (LOGGER_LOG)0x0) {
                                              iVar2 = 0x328;
                                              uVar13 = 5;
                                              pcVar10 = HTTPAPI_RESULTStringStorage[5];
LAB_0012c7b2:
                                              (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",iVar2,1,
                                                  "(result = %s%s (%d))","",pcVar10,uVar13);
                                            }
                                          }
                                          if (tempBuffer != (char *)0x0) {
                                            free(tempBuffer);
                                            tempBuffer = (char *)0x0;
                                          }
                                        }
                                        else {
                                          p_Var3 = xlogging_get_log_function();
                                          HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                          if (p_Var3 != (LOGGER_LOG)0x0) {
                                            iVar2 = 0x31b;
                                            goto LAB_0012c536;
                                          }
                                        }
                                      }
                                      else {
                                        p_Var3 = xlogging_get_log_function();
                                        HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                        if (p_Var3 != (LOGGER_LOG)0x0) {
                                          iVar2 = 0x310;
LAB_0012c536:
                                          HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                          uVar13 = 5;
                                          pcVar10 = HTTPAPI_RESULTStringStorage[5];
LAB_0012c53e:
                                          (*p_Var3)(AZ_LOG_ERROR,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",iVar2,1,
                                                  "(result = %s%s (%d))","",pcVar10,uVar13);
                                        }
                                      }
                                    }
                                    else {
                                      p_Var3 = xlogging_get_log_function();
                                      HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        iVar2 = 0x2f5;
                                        goto LAB_0012c536;
                                      }
                                    }
                                  }
LAB_0012c546:
                                  curl_slist_free_all(local_70);
                                  goto LAB_0012b9fc;
                                }
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x266;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x25f;
                              }
                              break;
                            case 2:
                              iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                                if (iVar2 == 0) goto LAB_0012c22d;
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x28a;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x283;
                              }
                              break;
                            case 3:
                              iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2734,"PUT");
                                if (iVar2 == 0) goto LAB_0012c22d;
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x29b;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x294;
                              }
                              break;
                            case 4:
                              iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2734,"DELETE");
                                if (iVar2 == 0) goto LAB_0012c22d;
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x2ab;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x2a4;
                              }
                              break;
                            case 5:
                              iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2734,"PATCH");
                                if (iVar2 == 0) goto LAB_0012c22d;
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 699;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x2b4;
                              }
                              break;
                            case 6:
                              iVar2 = curl_easy_setopt(handle->curl,0x50,1);
                              if (iVar2 == 0) {
                                iVar2 = curl_easy_setopt(handle->curl,0x2c,1);
                                if (iVar2 == 0) {
                                  iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                                  if (iVar2 == 0) goto LAB_0012c22d;
                                  p_Var3 = xlogging_get_log_function();
                                  HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                  if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                  pcVar10 = "(result = %s%s (%d))";
                                  iVar2 = 0x27a;
                                }
                                else {
                                  p_Var3 = xlogging_get_log_function();
                                  HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                  if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                  pcVar10 = "(result = %s%s (%d))";
                                  iVar2 = 0x275;
                                }
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                                pcVar10 = "(result = %s%s (%d))";
                                iVar2 = 0x270;
                              }
                              break;
                            default:
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                              pcVar10 = "(result = %s%s (%d))";
                              iVar2 = 600;
                              uVar13 = 2;
                              pcVar12 = HTTPAPI_RESULTStringStorage[2];
                              goto LAB_0012b9f4;
                            }
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            HVar8 = HTTPAPI_SET_OPTION_FAILED;
                            if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                            pcVar10 = "failed to set CURLOPT_HTTP_VERSION (result = %s%s (%d))";
                            iVar2 = 0x24e;
                          }
                        }
                        else {
                          p_Var3 = xlogging_get_log_function();
                          HVar8 = HTTPAPI_SET_OPTION_FAILED;
                          if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                          pcVar10 = "failed to set CURLOPT_FORBID_REUSE (result = %s%s (%d))";
                          iVar2 = 0x249;
                        }
                      }
                      else {
                        p_Var3 = xlogging_get_log_function();
                        HVar8 = HTTPAPI_SET_OPTION_FAILED;
                        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                        pcVar10 = "failed to set CURLOPT_FRESH_CONNECT (result = %s%s (%d))";
                        iVar2 = 0x244;
                      }
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      HVar8 = HTTPAPI_SET_OPTION_FAILED;
                      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                      pcVar10 = "failed to set CURLOPT_LOW_SPEED_TIME (result = %s%s (%d))";
                      iVar2 = 0x23f;
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    HVar8 = HTTPAPI_SET_OPTION_FAILED;
                    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                    pcVar10 = "failed to set CURLOPT_LOW_SPEED_LIMIT (result = %s%s (%d))";
                    iVar2 = 0x23a;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  HVar8 = HTTPAPI_SET_OPTION_FAILED;
                  if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                  pcVar10 = "failed to set CURLOPT_TIMEOUT_MS (result = %s%s (%d))";
                  iVar2 = 0x235;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                HVar8 = HTTPAPI_SET_OPTION_FAILED;
                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
                pcVar10 = "failed to set CURLOPT_URL (result = %s%s (%d))";
                iVar2 = 0x230;
              }
              goto LAB_0012b8a8;
            }
            p_Var3 = xlogging_get_log_function();
            HVar8 = HTTPAPI_STRING_PROCESSING_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
            pcVar10 = "(result = %s%s (%d))";
            iVar2 = 0x22a;
            uVar13 = 0xe;
            pcVar12 = HTTPAPI_RESULTStringStorage[0xe];
          }
          else {
            p_Var3 = xlogging_get_log_function();
            HVar8 = HTTPAPI_SET_OPTION_FAILED;
            if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b9fc;
            pcVar10 = "failed to set CURLOPT_VERBOSE (result = %s%s (%d))";
            iVar2 = 0x224;
LAB_0012b8a8:
            HVar8 = HTTPAPI_SET_OPTION_FAILED;
            uVar13 = 5;
            pcVar12 = HTTPAPI_RESULTStringStorage[5];
          }
LAB_0012b9f4:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                    ,"HTTPAPI_ExecuteRequest",iVar2,1,pcVar10,"",pcVar12,uVar13);
LAB_0012b9fc:
          free(pcVar6);
          return HVar8;
        }
      }
      p_Var3 = xlogging_get_log_function();
      HVar8 = HTTPAPI_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      iVar2 = 0x21d;
      uVar13 = 3;
      pcVar6 = HTTPAPI_RESULTStringStorage[3];
      goto LAB_0012b7c1;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    iVar2 = 0x209;
  }
  HVar8 = HTTPAPI_INVALID_ARG;
  uVar13 = 2;
  pcVar6 = HTTPAPI_RESULTStringStorage[2];
LAB_0012b7c1:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
            ,"HTTPAPI_ExecuteRequest",iVar2,1,"(result = %s%s (%d))","",pcVar6,uVar13);
  return HVar8;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_ExecuteRequest(HTTP_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
                                      HTTP_HEADERS_HANDLE httpHeadersHandle, const unsigned char* content,
                                      size_t contentLength, unsigned int* statusCode,
                                      HTTP_HEADERS_HANDLE responseHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPI_RESULT result;
    HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
    size_t headersCount;
    HTTP_RESPONSE_CONTENT_BUFFER responseContentBuffer;

    if ((httpHandleData == NULL) ||
        (relativePath == NULL) ||
        (httpHeadersHandle == NULL) ||
        ((content == NULL) && (contentLength > 0))
    )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else if (HTTPHeaders_GetHeaderCount(httpHeadersHandle, &headersCount) != HTTP_HEADERS_OK)
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else
    {
        char* tempHostURL;
        size_t tempHostURL_size = safe_add_size_t(strlen(httpHandleData->hostURL), strlen(relativePath));
        tempHostURL_size = safe_add_size_t(tempHostURL_size, 1);
        if (tempHostURL_size == SIZE_MAX)
        {
            LogError("Invalid malloc size");
            tempHostURL = NULL;
        }
        else
        {
            tempHostURL = malloc(tempHostURL_size);
        }

        if (tempHostURL == NULL)
        {
            result = HTTPAPI_ERROR;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
        }
        else
        {
            if (curl_easy_setopt(httpHandleData->curl, CURLOPT_VERBOSE, httpHandleData->verbose) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_VERBOSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if ((strcpy_s(tempHostURL, tempHostURL_size, httpHandleData->hostURL) != 0) ||
                (strcat_s(tempHostURL, tempHostURL_size, relativePath) != 0))
            {
                result = HTTPAPI_STRING_PROCESSING_ERROR;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            /* set the URL */
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_URL, tempHostURL) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_URL (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_TIMEOUT_MS, httpHandleData->timeout) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_TIMEOUT_MS (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_LIMIT, httpHandleData->lowSpeedLimit) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_LIMIT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_TIME, httpHandleData->lowSpeedTime) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_TIME (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FRESH_CONNECT, httpHandleData->freshConnect) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FRESH_CONNECT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FORBID_REUSE, httpHandleData->forbidReuse) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FORBID_REUSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_1) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_HTTP_VERSION (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                result = HTTPAPI_OK;

                switch (requestType)
                {
                default:
                    result = HTTPAPI_INVALID_ARG;
                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    break;

                case HTTPAPI_REQUEST_GET:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_HEAD:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_NOBODY, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }

                    break;

                case HTTPAPI_REQUEST_POST:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_PUT:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L))
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PUT") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_DELETE:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "DELETE") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_PATCH:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PATCH") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;
                }

                if (result == HTTPAPI_OK)
                {
                    /* add headers */
                    struct curl_slist* headers = NULL;
                    size_t i;

                    for (i = 0; i < headersCount; i++)
                    {
                        char *tempBuffer;
                        if (HTTPHeaders_GetHeader(httpHeadersHandle, i, &tempBuffer) != HTTP_HEADERS_OK)
                        {
                            /* error */
                            result = HTTPAPI_HTTP_HEADERS_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                            break;
                        }
                        else
                        {
                            struct curl_slist* newHeaders = curl_slist_append(headers, tempBuffer);
                            if (newHeaders == NULL)
                            {
                                result = HTTPAPI_ALLOC_FAILED;
                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                free(tempBuffer);
                                break;
                            }
                            else
                            {
                                free(tempBuffer);
                                headers = newHeaders;
                            }
                        }
                    }

                    if (result == HTTPAPI_OK)
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPHEADER, headers) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                        else
                        {
                            /* add content */
                            if ((content != NULL) &&
                                (contentLength > 0))
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)content) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, contentLength) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                            }
                            else
                            {
                                if (requestType != HTTPAPI_REQUEST_GET)
                                {
                                    if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)NULL) != CURLE_OK) ||
                                        (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, 0) != CURLE_OK))
                                    {
                                        result = HTTPAPI_SET_OPTION_FAILED;
                                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                    }
                                }
                                else
                                {
                                    /*GET request cannot POST, so "do nothing*/
                                }
                            }

                            if (result == HTTPAPI_OK)
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEFUNCTION, ContentWriteFunction) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                                else
                                {
                                    if (responseHeadersHandle != NULL)
                                    {
                                        /* setup the code to get the response headers */
                                        if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, responseHeadersHandle) != CURLE_OK) ||
                                            (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, HeadersWriteFunction) != CURLE_OK))
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }
                                    }

                                    if (result == HTTPAPI_OK)
                                    {
                                        responseContentBuffer.buffer = NULL;
                                        responseContentBuffer.bufferSize = 0;
                                        responseContentBuffer.error = 0;

                                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEDATA, &responseContentBuffer) != CURLE_OK)
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }

                                        if (result == HTTPAPI_OK)
                                        {
                                            /* Execute request */
                                            CURLcode curlRes = curl_easy_perform(httpHandleData->curl);
                                            if (curlRes != CURLE_OK)
                                            {
                                                LogError("curl_easy_perform() failed: %s\n", curl_easy_strerror(curlRes));
                                                result = HTTPAPI_OPEN_REQUEST_FAILED;
                                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                            }
                                            else
                                            {
                                                long httpCode;

                                                /* get the status code */
                                                if (curl_easy_getinfo(httpHandleData->curl, CURLINFO_RESPONSE_CODE, &httpCode) != CURLE_OK)
                                                {
                                                    result = HTTPAPI_QUERY_HEADERS_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else if (responseContentBuffer.error)
                                                {
                                                    result = HTTPAPI_READ_DATA_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else
                                                {
                                                    if (statusCode != NULL)
                                                    {
                                                        *statusCode = (unsigned int)httpCode;
                                                    }

                                                    /* fill response content length */
                                                    if (responseContent != NULL)
                                                    {
                                                        if ((responseContentBuffer.bufferSize > 0) && (BUFFER_build(responseContent, responseContentBuffer.buffer, responseContentBuffer.bufferSize) != 0))
                                                        {
                                                            result = HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                        }
                                                        else
                                                        {
                                                            /*all nice*/
                                                        }
                                                    }

                                                    if (httpCode >= 300)
                                                    {
                                                        LogError("Failure in HTTP communication: server reply code is %ld", httpCode);
                                                        LogInfo("HTTP Response:%*.*s", (int)responseContentBuffer.bufferSize,
                                                            (int)responseContentBuffer.bufferSize, responseContentBuffer.buffer);
                                                    }
                                                    else
                                                    {
                                                        result = HTTPAPI_OK;
                                                    }
                                                }
                                            }
                                        }

                                        if (responseContentBuffer.buffer != NULL)
                                        {
                                            free(responseContentBuffer.buffer);
                                            responseContentBuffer.buffer = NULL;
                                        }
                                    }
                                }
                            }
                        }
                    }
                    curl_slist_free_all(headers);
                }
            }
            free(tempHostURL);
        }
    }

    return result;
}